

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getKeyCode(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  int iVar1;
  invalid_argument *this;
  void *pvVar2;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_R9;
  KeyCodeAttribute *a;
  value_type *in_stack_fffffffffffffef8;
  vector<SetAttr,_std::allocator<SetAttr>_> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  SetAttr *in_stack_ffffffffffffff10;
  TypedAttribute<Imf_3_4::KeyCode> *in_stack_ffffffffffffff20;
  allocator<char> *in_stack_ffffffffffffff30;
  allocator<char> local_99;
  string local_98 [80];
  void *local_48;
  char *local_30;
  int *local_20;
  long local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  if (in_ESI + -8 < *in_RCX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Expected a key code");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  pvVar2 = operator_new(0x28);
  Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::TypedAttribute(in_stack_ffffffffffffff20);
  local_48 = pvVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8,local_30,in_stack_ffffffffffffff30);
  SetAttr::SetAttr(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                   (Attribute *)in_stack_fffffffffffffef8);
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  SetAttr::~SetAttr((SetAttr *)0x1072b8);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  iVar1 = Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
  strtol(*(char **)(local_18 + (long)(*local_20 + 1) * 8),(char **)0x0,0);
  Imf_3_4::KeyCode::setFilmMfcCode(iVar1);
  iVar1 = Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
  strtol(*(char **)(local_18 + (long)(*local_20 + 2) * 8),(char **)0x0,0);
  Imf_3_4::KeyCode::setFilmType(iVar1);
  iVar1 = Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
  strtol(*(char **)(local_18 + (long)(*local_20 + 3) * 8),(char **)0x0,0);
  Imf_3_4::KeyCode::setPrefix(iVar1);
  iVar1 = Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
  strtol(*(char **)(local_18 + (long)(*local_20 + 4) * 8),(char **)0x0,0);
  Imf_3_4::KeyCode::setCount(iVar1);
  iVar1 = Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
  strtol(*(char **)(local_18 + (long)(*local_20 + 5) * 8),(char **)0x0,0);
  Imf_3_4::KeyCode::setPerfOffset(iVar1);
  iVar1 = Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
  strtol(*(char **)(local_18 + (long)(*local_20 + 6) * 8),(char **)0x0,0);
  Imf_3_4::KeyCode::setPerfsPerFrame(iVar1);
  iVar1 = Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::value();
  strtol(*(char **)(local_18 + (long)(*local_20 + 7) * 8),(char **)0x0,0);
  Imf_3_4::KeyCode::setPerfsPerCount(iVar1);
  *local_20 = *local_20 + 8;
  return;
}

Assistant:

void
getKeyCode (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 8) throw invalid_argument ("Expected a key code");

    KeyCodeAttribute* a = new KeyCodeAttribute;
    attrs.push_back (SetAttr (attrName, part, a));

    a->value ().setFilmMfcCode (strtol (argv[i + 1], 0, 0));
    a->value ().setFilmType (strtol (argv[i + 2], 0, 0));
    a->value ().setPrefix (strtol (argv[i + 3], 0, 0));
    a->value ().setCount (strtol (argv[i + 4], 0, 0));
    a->value ().setPerfOffset (strtol (argv[i + 5], 0, 0));
    a->value ().setPerfsPerFrame (strtol (argv[i + 6], 0, 0));
    a->value ().setPerfsPerCount (strtol (argv[i + 7], 0, 0));
    i += 8;
}